

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder * __thiscall
capnp::_::PointerBuilder::getStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size,
          word *defaultValue)

{
  word *defaultValue_local;
  PointerBuilder *this_local;
  StructSize size_local;
  
  WireHelpers::getWritableStructPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,size,defaultValue);
  return __return_storage_ptr__;
}

Assistant:

StructBuilder PointerBuilder::getStruct(StructSize size, const word* defaultValue) {
  return WireHelpers::getWritableStructPointer(pointer, segment, capTable, size, defaultValue);
}